

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = **(ulong **)this;
  if ((uVar1 & 1) == 0) {
    uVar3 = *(ulong *)(uVar1 + 8);
    uVar2 = *(ulong *)(uVar1 + 0x10);
  }
  else {
    uVar2 = (ulong)((uint)((long)(uVar1 << 0x3e) >> 0x3f) & 0x1b);
    uVar3 = (long)(uVar1 << 0x3e) >> 0x3f & 0x2e5f10;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,uVar3,uVar2 + uVar3);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}